

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::ImmediatePromiseNode<unsigned_int>::ImmediatePromiseNode
          (ImmediatePromiseNode<unsigned_int> *this,ExceptionOr<unsigned_int> *result)

{
  ExceptionOr<unsigned_int> *pEVar1;
  ExceptionOr<unsigned_int> *result_local;
  ImmediatePromiseNode<unsigned_int> *this_local;
  
  ImmediatePromiseNodeBase::ImmediatePromiseNodeBase(&this->super_ImmediatePromiseNodeBase);
  (this->super_ImmediatePromiseNodeBase).super_PromiseNode._vptr_PromiseNode =
       (_func_int **)&PTR_onReady_007c7208;
  pEVar1 = mv<kj::_::ExceptionOr<unsigned_int>>(result);
  ExceptionOr<unsigned_int>::ExceptionOr(&this->result,pEVar1);
  return;
}

Assistant:

ImmediatePromiseNode(ExceptionOr<T>&& result): result(kj::mv(result)) {}